

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap_unittest.cc
# Opt level: O1

void __thiscall AddressMapUnittest_Basic_Test::TestBody(AddressMapUnittest_Basic_Test *this)

{
  size_t *psVar1;
  pointer pPVar2;
  _Head_base<0UL,_char_*,_false> _Var3;
  Object *pOVar4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var5;
  internal iVar6;
  char cVar7;
  size_t sVar8;
  bool bVar9;
  size_t __i;
  long lVar10;
  result_type rVar11;
  Object *pOVar12;
  pair<int,_unsigned_long> *ppVar13;
  long *plVar14;
  int *lhs;
  long *plVar15;
  pointer pPVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  AssertionResult *pAVar18;
  char *pcVar19;
  char *in_R9;
  int iVar20;
  undefined4 uVar21;
  pointer *__ptr;
  ulong uVar22;
  pair<int,_unsigned_long> value;
  pair<int,_unsigned_long> value_00;
  pair<int,_unsigned_long> value_01;
  pair<int,_unsigned_long> value_02;
  pair<std::_Rb_tree_iterator<std::pair<const_void_*,_int>_>,_std::_Rb_tree_iterator<std::pair<const_void_*,_int>_>_>
  pVar23;
  FunctionRef<void_(const_void_*,_std::pair<int,_unsigned_long>_*)> body;
  undefined1 local_1488 [8];
  mt19937 rng;
  int N;
  vector<PtrAndSize,_std::allocator<PtrAndSize>_> ptrs_and_sizes;
  Object *local_d8;
  size_t s;
  code *local_c8;
  code *local_c0;
  Object *local_b8;
  Key local_b0;
  void *res_p;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  char *p;
  undefined1 local_90 [8];
  set<std::pair<const_void_*,_int>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
  check_set;
  AssertionResult gtest_ar_;
  AssertHelper local_40;
  AssertHelper local_38;
  
  rng._M_p._0_4_ = 100000;
  local_1488 = (undefined1  [8])0x0;
  lVar10 = 1;
  uVar22 = 0;
  do {
    uVar22 = (ulong)(((uint)(uVar22 >> 0x1e) ^ (uint)uVar22) * 0x6c078965 + (int)lVar10);
    rng._M_x[lVar10 + -1] = uVar22;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x270);
  rng._M_x[0x26f] = 0x270;
  _N = (PtrAndSize *)0x0;
  ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::reserve
            ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)&N,100000);
  iVar20 = 100000;
  do {
    local_90 = (undefined1  [8])0x0;
    check_set._M_t._M_impl._0_8_ = 0x2f;
    rVar11 = std::uniform_int_distribution<unsigned_long>::operator()
                       ((uniform_int_distribution<unsigned_long> *)local_90,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)local_1488,(param_type *)local_90);
    local_d8 = (Object *)(rVar11 + 1);
    local_90 = (undefined1  [8])operator_new__((ulong)local_d8);
    std::vector<PtrAndSize,std::allocator<PtrAndSize>>::emplace_back<char*,unsigned_long&>
              ((vector<PtrAndSize,std::allocator<PtrAndSize>> *)&N,(char **)local_90,
               (unsigned_long *)&stack0xffffffffffffff28);
    iVar20 = iVar20 + -1;
  } while (iVar20 != 0);
  uVar22 = 0;
LAB_0010879d:
  rng._M_p._4_4_ = (int)uVar22;
  printf("Iteration %d/%d...\n",uVar22,0x14);
  std::
  shuffle<__gnu_cxx::__normal_iterator<PtrAndSize*,std::vector<PtrAndSize,std::allocator<PtrAndSize>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            (_N,(__normal_iterator<PtrAndSize_*,_std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>_>
                 )ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl
                  .super__Vector_impl_data._M_start,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_1488);
  s = 0;
  local_c8 = malloc;
  local_c0 = free;
  local_b8 = (Object *)0x0;
  pOVar12 = (Object *)malloc(0x8008);
  memset(pOVar12,0,0x8008);
  local_d8 = pOVar12 + 1;
  res_p._4_4_ = 0;
  local_b8 = pOVar12;
  do {
    local_a0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         _N[res_p._4_4_].ptr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    plVar14 = (long *)((long)&local_d8->next +
                      (ulong)((uint)((int)((ulong)local_a0._M_head_impl >> 0x14) * -0x61c88647) >>
                              0x11 & 0xfffffff8));
    do {
      plVar14 = (long *)*plVar14;
      if (plVar14 == (long *)0x0) {
        plVar14 = (long *)0x0;
        break;
      }
    } while (plVar14[1] != (ulong)local_a0._M_head_impl >> 0x14);
    if (plVar14 == (long *)0x0) {
LAB_001088a6:
      uVar22 = 0;
    }
    else {
      uVar22 = (ulong)((uint)((ulong)local_a0._M_head_impl >> 4) & 0xfff8);
      plVar14 = (long *)((long)plVar14 + uVar22 + 0x10);
      do {
        plVar14 = (long *)*plVar14;
        if (plVar14 == (long *)0x0) goto LAB_001088a1;
      } while ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar14[1]
               != local_a0._M_head_impl);
      uVar22 = (ulong)(plVar14 + 2);
LAB_001088a1:
      if (plVar14 == (long *)0x0) goto LAB_001088a6;
    }
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,uVar22 == 0);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (uVar22 != 0) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,
                 (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (AssertionResult *)0x13a12a,"true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x5d,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      goto LAB_00109952;
    }
    check_set._M_t._M_impl._0_8_ = _N[res_p._4_4_].size - 1;
    local_90 = (undefined1  [8])0x0;
    rVar11 = std::uniform_int_distribution<unsigned_long>::operator()
                       ((uniform_int_distribution<unsigned_long> *)local_90,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)local_1488,(param_type *)local_90);
    ppVar13 = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                        ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff28,
                         SizeFunc,0x6400000,local_a0._M_head_impl + (int)rVar11,&local_b0);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                  ppVar13 == (pair<int,_unsigned_long> *)0x0);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (ppVar13 != (pair<int,_unsigned_long> *)0x0) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,
                 (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (AssertionResult *)0x13a1cb,"true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x5f,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      goto LAB_00109952;
    }
    value._0_8_ = (long)res_p._4_4_;
    value.second = _N[value._0_8_].size;
    AddressMap<std::pair<int,_unsigned_long>_>::Insert
              ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff28,
               local_a0._M_head_impl,value);
    plVar14 = (long *)((long)&local_d8->next +
                      (ulong)((uint)((int)((ulong)local_a0._M_head_impl >> 0x14) * -0x61c88647) >>
                              0x11 & 0xfffffff8));
    do {
      plVar14 = (long *)*plVar14;
      if (plVar14 == (long *)0x0) {
        plVar14 = (long *)0x0;
        break;
      }
    } while (plVar14[1] != (ulong)local_a0._M_head_impl >> 0x14);
    if (plVar14 == (long *)0x0) {
LAB_001089c0:
      plVar14 = (long *)0x0;
    }
    else {
      plVar15 = (long *)((long)plVar14 +
                        (ulong)((uint)((ulong)local_a0._M_head_impl >> 4) & 0xfff8) + 0x10);
      do {
        plVar15 = (long *)*plVar15;
        if (plVar15 == (long *)0x0) goto LAB_001089bb;
      } while ((_Base_ptr)plVar15[1] != (_Base_ptr)local_a0._M_head_impl);
      plVar14 = plVar15 + 2;
LAB_001089bb:
      if (plVar15 == (long *)0x0) goto LAB_001089c0;
    }
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                  plVar14 != (long *)0x0);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (plVar14 == (long *)0x0) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,
                 (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x61,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      goto LAB_00109952;
    }
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"result->first","i",(int *)plVar14,(int *)((long)&res_p + 4));
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (check_set._M_t._M_impl._0_8_ == 0) {
        pcVar19 = "";
      }
      else {
        pcVar19 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x62,pcVar19);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_00109a2a;
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    ppVar13 = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                        ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff28,
                         SizeFunc,0x31,local_a0._M_head_impl + (int)rVar11,&local_b0);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                  ppVar13 != (pair<int,_unsigned_long> *)0x0);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    psVar1 = &check_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (ppVar13 == (pair<int,_unsigned_long> *)0x0) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,
                 (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (AssertionResult *)
                 "result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,99,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      goto LAB_00109952;
    }
    testing::internal::CmpHelperEQ<void_const*,char*>
              ((internal *)local_90,"res_p","p",&local_b0,(char **)&local_a0);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (check_set._M_t._M_impl._0_8_ == 0) {
        pcVar19 = "";
      }
      else {
        pcVar19 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,100,pcVar19);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_00109a2a;
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"result->first","i",&ppVar13->first,(int *)((long)&res_p + 4));
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (check_set._M_t._M_impl._0_8_ == 0) {
        pcVar19 = "";
      }
      else {
        pcVar19 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x65,pcVar19);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_00109a2a;
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    value_00.first = res_p._4_4_ + 100000;
    value_00._4_4_ = 0;
    value_00.second = _N[res_p._4_4_].size;
    AddressMap<std::pair<int,_unsigned_long>_>::Insert
              ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff28,
               local_a0._M_head_impl,value_00);
    sVar8 = check_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
    plVar14 = (long *)((long)&local_d8->next +
                      (ulong)((uint)((int)((ulong)local_a0._M_head_impl >> 0x14) * -0x61c88647) >>
                              0x11 & 0xfffffff8));
    do {
      plVar14 = (long *)*plVar14;
      if (plVar14 == (long *)0x0) {
        plVar14 = (long *)0x0;
        break;
      }
    } while (plVar14[1] != (ulong)local_a0._M_head_impl >> 0x14);
    if (plVar14 == (long *)0x0) {
LAB_00108b6b:
      plVar14 = (long *)0x0;
    }
    else {
      plVar15 = (long *)((long)plVar14 +
                        (ulong)((uint)((ulong)local_a0._M_head_impl >> 4) & 0xfff8) + 0x10);
      do {
        plVar15 = (long *)*plVar15;
        if (plVar15 == (long *)0x0) goto LAB_00108b66;
      } while ((_Base_ptr)plVar15[1] != (_Base_ptr)local_a0._M_head_impl);
      plVar14 = plVar15 + 2;
LAB_00108b66:
      if (plVar15 == (long *)0x0) goto LAB_00108b6b;
    }
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                  plVar14 != (long *)0x0);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (plVar14 == (long *)0x0) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,
                 (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x67,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      goto LAB_00109952;
    }
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = SUB84(sVar8,4);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT44(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                  res_p._4_4_ + 100000);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"result->first","i + N",(int *)plVar14,(int *)psVar1);
    iVar6 = local_90[0];
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)psVar1);
      pcVar19 = "";
      if (check_set._M_t._M_impl._0_8_ != 0) {
        pcVar19 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x68,pcVar19);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)psVar1);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (check_set._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        (**(code **)(*(long *)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count + 8))();
      }
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    pOVar12 = local_b8;
    if (iVar6 == (internal)0x0) goto LAB_00109a5b;
    iVar20 = res_p._4_4_ + 1;
    bVar9 = res_p._4_4_ < 99999;
    res_p._4_4_ = iVar20;
  } while (bVar9);
  uVar22 = 0xfffffffffffffffe;
  lVar10 = 0;
  do {
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         check_set._M_t._M_impl.super__Rb_tree_header._M_node_count & 0xffffffff00000000;
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    bVar9 = AddressMap<std::pair<int,_unsigned_long>_>::FindAndRemove
                      ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff28,
                       *(Key *)((long)&(_N->ptr)._M_t.
                                       super___uniq_ptr_impl<char,_std::default_delete<char>_>._M_t.
                                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char>_>.
                                       super__Head_base<0UL,_char_*,_false>._M_head_impl + lVar10),
                       (pair<int,_unsigned_long> *)
                       &check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_a0._M_head_impl._0_1_ = bVar9;
    p = (char *)0x0;
    if (!bVar9) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,(internal *)&local_a0,
                 (AssertionResult *)"map.FindAndRemove(p, &removed)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x6f,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_90 != (undefined1  [8])&check_set._M_t._M_impl.super__Rb_tree_header) {
        operator_delete((void *)local_90,
                        check_set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
      }
      if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
      }
      if (p != (char *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&p,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p);
      }
      pOVar12 = local_b8;
      if (!bVar9) goto LAB_00109a5b;
    }
    local_a0._M_head_impl._0_4_ = (int)uVar22 + 0x186a2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"removed.first","i + N",
               (int *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,(int *)&local_a0);
    iVar6 = local_90[0];
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_a0);
      pcVar19 = "";
      if (check_set._M_t._M_impl._0_8_ != 0) {
        pcVar19 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x70,pcVar19);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((_Base_ptr)local_a0._M_head_impl != (_Base_ptr)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
      }
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    pOVar12 = local_b8;
    if (iVar6 == (internal)0x0) goto LAB_00109a5b;
    uVar22 = uVar22 + 2;
    lVar10 = lVar10 + 0x20;
  } while (uVar22 < 0x1869e);
  pPVar16 = (pointer)0x1;
  do {
    sVar8 = check_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_a0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         _N[(long)pPVar16].ptr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    plVar14 = (long *)((long)&local_d8->next +
                      (ulong)((uint)((int)((ulong)local_a0._M_head_impl >> 0x14) * -0x61c88647) >>
                              0x11 & 0xfffffff8));
    do {
      plVar14 = (long *)*plVar14;
      if (plVar14 == (long *)0x0) {
        plVar14 = (long *)0x0;
        break;
      }
    } while (plVar14[1] != (ulong)local_a0._M_head_impl >> 0x14);
    if (plVar14 == (long *)0x0) {
LAB_00108e9a:
      plVar14 = (long *)0x0;
    }
    else {
      plVar15 = (long *)((long)plVar14 +
                        (ulong)((uint)((ulong)local_a0._M_head_impl >> 4) & 0xfff8) + 0x10);
      do {
        plVar15 = (long *)*plVar15;
        if (plVar15 == (long *)0x0) goto LAB_00108e95;
      } while ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar15[1]
               != local_a0._M_head_impl);
      plVar14 = plVar15 + 2;
LAB_00108e95:
      if (plVar15 == (long *)0x0) goto LAB_00108e9a;
    }
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                  plVar14 != (long *)0x0);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (plVar14 == (long *)0x0) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,
                 (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x76,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      goto LAB_00109952;
    }
    iVar20 = (int)pPVar16 + 100000;
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = SUB84(sVar8,4);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT44(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,iVar20);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"result->first","i + N",(int *)plVar14,
               (int *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (check_set._M_t._M_impl._0_8_ == 0) {
        pcVar19 = "";
      }
      else {
        pcVar19 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x77,pcVar19);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_00109a2a;
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    check_set._M_t._M_impl._0_8_ = _N[(long)pPVar16].size - 1;
    local_90 = (undefined1  [8])0x0;
    ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pPVar16;
    rVar11 = std::uniform_int_distribution<unsigned_long>::operator()
                       ((uniform_int_distribution<unsigned_long> *)local_90,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)local_1488,(param_type *)local_90);
    ppVar13 = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                        ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff28,
                         SizeFunc,0x31,local_a0._M_head_impl + (int)rVar11,&local_b0);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                  ppVar13 != (pair<int,_unsigned_long> *)0x0);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (ppVar13 == (pair<int,_unsigned_long> *)0x0) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,
                 (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (AssertionResult *)
                 "result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x79,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      goto LAB_00109952;
    }
    testing::internal::CmpHelperEQ<void_const*,char*>
              ((internal *)local_90,"res_p","p",&local_b0,(char **)&local_a0);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (check_set._M_t._M_impl._0_8_ == 0) {
        pcVar19 = "";
      }
      else {
        pcVar19 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x7a,pcVar19);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_00109a2a;
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT44(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,iVar20);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"result->first","i + N",&ppVar13->first,
               (int *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pPVar2 = ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (check_set._M_t._M_impl._0_8_ == 0) {
        pcVar19 = "";
      }
      else {
        pcVar19 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x7b,pcVar19);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_00109a2a;
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    value_01._0_8_ = (ulong)(pPVar2 + 0x30d4) & 0xffffffff;
    value_01.second = _N[(long)pPVar16].size;
    AddressMap<std::pair<int,_unsigned_long>_>::Insert
              ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff28,
               local_a0._M_head_impl,value_01);
    sVar8 = check_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
    plVar14 = (long *)((long)&local_d8->next +
                      (ulong)((uint)((int)((ulong)local_a0._M_head_impl >> 0x14) * -0x61c88647) >>
                              0x11 & 0xfffffff8));
    psVar1 = &check_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      plVar14 = (long *)*plVar14;
      if (plVar14 == (long *)0x0) {
        plVar14 = (long *)0x0;
        break;
      }
    } while (plVar14[1] != (ulong)local_a0._M_head_impl >> 0x14);
    if (plVar14 == (long *)0x0) {
LAB_0010908c:
      plVar14 = (long *)0x0;
    }
    else {
      plVar15 = (long *)((long)plVar14 +
                        (ulong)((uint)((ulong)local_a0._M_head_impl >> 4) & 0xfff8) + 0x10);
      do {
        plVar15 = (long *)*plVar15;
        if (plVar15 == (long *)0x0) goto LAB_00109087;
      } while ((_Base_ptr)plVar15[1] != (_Base_ptr)local_a0._M_head_impl);
      plVar14 = plVar15 + 2;
LAB_00109087:
      if (plVar15 == (long *)0x0) goto LAB_0010908c;
    }
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                  plVar14 != (long *)0x0);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (plVar14 == (long *)0x0) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,
                 (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x7d,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      goto LAB_00109952;
    }
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = SUB84(sVar8,4);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT44(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                  (int)(pPVar2 + 0x30d4));
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"result->first","i + 2*N",(int *)plVar14,(int *)psVar1);
    iVar6 = local_90[0];
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)psVar1);
      pcVar19 = "";
      if (check_set._M_t._M_impl._0_8_ != 0) {
        pcVar19 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x7e,pcVar19);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)psVar1);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (check_set._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        (**(code **)(*(long *)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count + 8))();
      }
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    pOVar12 = local_b8;
    if (iVar6 == (internal)0x0) goto LAB_00109a5b;
    pPVar16 = (pointer)((long)&((ptrs_and_sizes.
                                 super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage)->ptr)._M_t.
                               super___uniq_ptr_impl<char,_std::default_delete<char>_>._M_t.
                               super__Tuple_impl<0UL,_char_*,_std::default_delete<char>_>.
                               super__Head_base<0UL,_char_*,_false>._M_head_impl + 2);
  } while (ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage < (pointer)0x1869e);
  pPVar16 = (pointer)0x0;
LAB_00109150:
  local_a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       _N[(long)pPVar16].ptr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  check_set._M_t._M_impl._0_8_ = _N[(long)pPVar16].size - 1;
  local_90 = (undefined1  [8])0x0;
  ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pPVar16;
  rVar11 = std::uniform_int_distribution<unsigned_long>::operator()
                     ((uniform_int_distribution<unsigned_long> *)local_90,
                      (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                       *)local_1488,(param_type *)local_90);
  ppVar13 = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                      ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff28,
                       SizeFunc,0x6400000,local_a0._M_head_impl + (int)rVar11,&local_b0);
  check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                ppVar13 == (pair<int,_unsigned_long> *)0x0);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (ppVar13 != (pair<int,_unsigned_long> *)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,
               (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (AssertionResult *)"!map.FindInside(&SizeFunc, kMaxSize, p + offs, &res_p)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
               ,0x85,(char *)local_90);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    goto LAB_00109952;
  }
  pPVar2 = ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 0x30d4;
  value_02.second = _N[(long)pPVar16].size;
  value_02._0_8_ = pPVar2;
  AddressMap<std::pair<int,_unsigned_long>_>::Insert
            ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff28,
             local_a0._M_head_impl,value_02);
  sVar8 = check_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
  plVar14 = (long *)((long)&local_d8->next +
                    (ulong)((uint)((int)((ulong)local_a0._M_head_impl >> 0x14) * -0x61c88647) >>
                            0x11 & 0xfffffff8));
  do {
    plVar14 = (long *)*plVar14;
    if (plVar14 == (long *)0x0) {
      plVar14 = (long *)0x0;
      break;
    }
  } while (plVar14[1] != (ulong)local_a0._M_head_impl >> 0x14);
  if (plVar14 == (long *)0x0) {
LAB_00109273:
    plVar14 = (long *)0x0;
  }
  else {
    plVar15 = (long *)((long)plVar14 +
                      (ulong)((uint)((ulong)local_a0._M_head_impl >> 4) & 0xfff8) + 0x10);
    do {
      plVar15 = (long *)*plVar15;
      if (plVar15 == (long *)0x0) goto LAB_0010926e;
    } while ((_Base_ptr)plVar15[1] != (_Base_ptr)local_a0._M_head_impl);
    plVar14 = plVar15 + 2;
LAB_0010926e:
    if (plVar15 == (long *)0x0) goto LAB_00109273;
  }
  check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                plVar14 != (long *)0x0);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (plVar14 == (long *)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,
               (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
               ,0x87,(char *)local_90);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
LAB_00109952:
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_90 != (undefined1  [8])&check_set._M_t._M_impl.super__Rb_tree_header) {
      operator_delete((void *)local_90,
                      check_set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    pOVar12 = local_b8;
    if (gtest_ar_._0_8_ == 0) goto LAB_00109a5b;
    pAVar18 = &gtest_ar_;
    pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar_._0_8_;
  }
  else {
    uVar21 = SUB84(pPVar2,0);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = SUB84(sVar8,4);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT44(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,uVar21);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"result->first","i + 2*N",(int *)plVar14,
               (int *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (local_90[0] != (internal)0x0) {
      if (check_set._M_t._M_impl._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&check_set,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     check_set._M_t._M_impl._0_8_);
      }
      ppVar13 = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                          ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff28,
                           SizeFunc,0x31,local_a0._M_head_impl + (int)rVar11,&local_b0);
      check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
           CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                    ppVar13 != (pair<int,_unsigned_long> *)0x0);
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      psVar1 = &check_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (ppVar13 == (pair<int,_unsigned_long> *)0x0) {
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_90,
                   (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (AssertionResult *)
                   "result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x89,(char *)local_90);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
        goto LAB_00109952;
      }
      testing::internal::CmpHelperEQ<void_const*,char*>
                ((internal *)local_90,"res_p","p",&local_b0,(char **)&local_a0);
      if (local_90[0] == (internal)0x0) {
        testing::Message::Message
                  ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if (check_set._M_t._M_impl._0_8_ == 0) {
          pcVar19 = "";
        }
        else {
          pcVar19 = *(char **)check_set._M_t._M_impl._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x8a,pcVar19);
        testing::internal::AssertHelper::operator=
                  (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
        goto LAB_00109a2a;
      }
      if (check_set._M_t._M_impl._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&check_set,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     check_set._M_t._M_impl._0_8_);
      }
      check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
           CONCAT44(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,uVar21);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_90,"result->first","i + 2*N",&ppVar13->first,(int *)psVar1);
      iVar6 = local_90[0];
      if (local_90[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar19 = "";
        if (check_set._M_t._M_impl._0_8_ != 0) {
          pcVar19 = *(char **)check_set._M_t._M_impl._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x8b,pcVar19);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (check_set._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          (**(code **)(*(long *)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count + 8))();
        }
      }
      if (check_set._M_t._M_impl._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&check_set,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     check_set._M_t._M_impl._0_8_);
      }
      pOVar12 = local_b8;
      if (iVar6 == (internal)0x0) goto LAB_00109a5b;
      pPVar16 = (pointer)((long)&((ptrs_and_sizes.
                                   super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage)->ptr)._M_t.
                                 super___uniq_ptr_impl<char,_std::default_delete<char>_>._M_t.
                                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char>_>.
                                 super__Head_base<0UL,_char_*,_false>._M_head_impl + 2);
      if ((pointer)0x1869d <
          ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) goto code_r0x001093fd;
      goto LAB_00109150;
    }
    testing::Message::Message
              ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (check_set._M_t._M_impl._0_8_ == 0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = *(char **)check_set._M_t._M_impl._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
               ,0x88,pcVar19);
    testing::internal::AssertHelper::operator=
              (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
LAB_00109a2a:
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (check_set._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      (**(code **)(*(long *)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count + 8))();
    }
    pOVar12 = local_b8;
    if (check_set._M_t._M_impl._0_8_ == 0) goto LAB_00109a5b;
    pAVar18 = (AssertionResult *)&check_set;
    pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              check_set._M_t._M_impl._0_8_;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)pAVar18,pbVar17);
  pOVar12 = local_b8;
LAB_00109a5b:
  while (pOVar12 != (Object *)0x0) {
    pOVar4 = pOVar12->next;
    (*local_c0)(pOVar12);
    pOVar12 = pOVar4;
  }
  goto LAB_001096fa;
code_r0x001093fd:
  check_set._M_t._M_impl._0_8_ = check_set._M_t._M_impl._0_8_ & 0xffffffff00000000;
  check_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  check_set._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  check_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&check_set;
  check_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  psVar1 = &check_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
  body.data = psVar1;
  body.fn = tcmalloc::FunctionRef<void(void_const*,std::pair<int,unsigned_long>*)>::
            FunctionRef<AddressMapUnittest_Basic_Test::TestBody()::$_0,void>(AddressMapUnittest_Basic_Test::TestBody()::$_0_const&)
            ::{lambda(void_const*,std::pair<int,unsigned_long>*,void*)#1}::
            pair<int,unsigned_long>__void__;
  check_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       check_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  check_set._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_90;
  AddressMap<std::pair<int,_unsigned_long>_>::Iterate
            ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff28,body);
  local_a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       check_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)psVar1,"check_set.size()","N",(unsigned_long *)&local_a0,(int *)&rng._M_p);
  if ((char)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count != '\0') {
    if (gtest_ar_._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar_._0_8_);
    }
    lVar10 = 0;
    do {
      _Var3._M_head_impl =
           _N[lVar10].ptr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
      iVar20 = (int)lVar10 + 200000;
      gtest_ar_._0_4_ = iVar20;
      check_set._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)_Var3._M_head_impl;
      pVar23 = std::
               _Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
               ::equal_range((_Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
                              *)local_90,
                             (key_type *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count
                            );
      std::
      _Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
      ::_M_erase_aux((_Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
                      *)local_90,(_Base_ptr)pVar23.first._M_node,(_Base_ptr)pVar23.second._M_node);
      _Var5._M_head_impl = local_a0._M_head_impl;
      plVar14 = (long *)((long)&local_d8->next +
                        (ulong)((uint)((int)((ulong)_Var3._M_head_impl >> 0x14) * -0x61c88647) >>
                                0x11 & 0xfffffff8));
      do {
        plVar14 = (long *)*plVar14;
        if (plVar14 == (long *)0x0) {
          plVar14 = (long *)0x0;
          break;
        }
      } while (plVar14[1] != (ulong)_Var3._M_head_impl >> 0x14);
      if (plVar14 == (long *)0x0) {
LAB_0010951c:
        lhs = (int *)0x0;
      }
      else {
        lhs = (int *)(ulong)((uint)((ulong)_Var3._M_head_impl >> 4) & 0xfff8);
        plVar14 = (long *)((long)lhs + (long)plVar14 + 0x10);
        do {
          plVar14 = (long *)*plVar14;
          if (plVar14 == (long *)0x0) goto LAB_00109517;
        } while ((char *)plVar14[1] != _Var3._M_head_impl);
        lhs = (int *)(plVar14 + 2);
LAB_00109517:
        if (plVar14 == (long *)0x0) goto LAB_0010951c;
      }
      local_a0._M_head_impl._0_1_ = lhs != (int *)0x0;
      p = (char *)0x0;
      if (lhs == (int *)0x0) {
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (internal *)&local_a0,(AssertionResult *)"result = map.Find(p)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x97,(char *)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count != &gtest_ar_.message_) {
          operator_delete((void *)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (long)gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 1);
        }
        if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
        }
        if (p == (char *)0x0) goto LAB_00109ee1;
        pAVar18 = (AssertionResult *)&p;
        pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p;
        goto LAB_00109edc;
      }
      local_a0._M_head_impl._4_4_ = SUB84(_Var5._M_head_impl,4);
      local_a0._M_head_impl._0_4_ = iVar20;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 "result->first","i + 2*N",lhs,(int *)&local_a0);
      cVar7 = (char)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if ((char)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count == '\0') {
        testing::Message::Message((Message *)&local_a0);
        pcVar19 = "";
        if (gtest_ar_._0_8_ != 0) {
          pcVar19 = *(char **)gtest_ar_._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x98,pcVar19);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((_Base_ptr)local_a0._M_head_impl != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_a0._M_head_impl + 8))();
        }
      }
      if (gtest_ar_._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar_._0_8_);
      }
      if (cVar7 == '\0') goto LAB_00109ee1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 100000);
    local_a0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         check_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    local_38.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
               "check_set.size()","0",(unsigned_long *)&local_a0,(int *)&local_38);
    cVar7 = (char)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if ((char)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count == '\0') {
      testing::Message::Message((Message *)&local_a0);
      pcVar19 = "";
      if (gtest_ar_._0_8_ != 0) {
        pcVar19 = *(char **)gtest_ar_._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x9a,pcVar19);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((_Base_ptr)local_a0._M_head_impl != (_Base_ptr)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
      }
    }
    if (gtest_ar_._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar_._0_8_);
    }
    std::
    _Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
                 *)local_90);
    pOVar12 = local_b8;
    while (pOVar12 != (Object *)0x0) {
      pOVar4 = pOVar12->next;
      (*local_c0)(pOVar12);
      pOVar12 = pOVar4;
    }
    if ((cVar7 == '\0') || (uVar22 = (ulong)(rng._M_p._4_4_ + 1U), rng._M_p._4_4_ + 1U == 0x14))
    goto LAB_001096fa;
    goto LAB_0010879d;
  }
  testing::Message::Message((Message *)&local_a0);
  if (gtest_ar_._0_8_ == 0) {
    pcVar19 = "";
  }
  else {
    pcVar19 = *(char **)gtest_ar_._0_8_;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
             ,0x93,pcVar19);
  testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_a0);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if ((_Base_ptr)local_a0._M_head_impl != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_a0._M_head_impl + 8))();
  }
  if (gtest_ar_._0_8_ != 0) {
    pAVar18 = &gtest_ar_;
    pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar_._0_8_;
LAB_00109edc:
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)pAVar18,pbVar17);
  }
LAB_00109ee1:
  std::
  _Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
               *)local_90);
  pOVar12 = local_b8;
  while (pOVar12 != (Object *)0x0) {
    pOVar4 = pOVar12->next;
    (*local_c0)(pOVar12);
    pOVar12 = pOVar4;
  }
LAB_001096fa:
  std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::~vector
            ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)&N);
  return;
}

Assistant:

TEST(AddressMapUnittest, Basic) {
  constexpr int N = 100000;
  constexpr int kIters = 20;
  constexpr int kMaxRealSize = 49;
  // 100Mb to stress not finding previous object (AddressMap's cluster is 1Mb):
  constexpr size_t kMaxSize = 100 << 20;

  std::mt19937 rng(0);

  // generates uniformly distributed size_t in range [0, n)
  auto uniform = [&] (size_t n) -> size_t {
    return std::uniform_int_distribution<size_t>{0, n-1}(rng);
  };

  std::vector<PtrAndSize> ptrs_and_sizes;
  ptrs_and_sizes.reserve(N);
  for (int i = 0; i < N; ++i) {
    size_t s = uniform(kMaxRealSize-1) + 1;
    ptrs_and_sizes.emplace_back(new char[s], s);
  }

  for (int x = 0; x < kIters; ++x) {
    printf("Iteration %d/%d...\n", x, kIters);

    // Permute pointers to get rid of allocation order issues
    std::shuffle(ptrs_and_sizes.begin(), ptrs_and_sizes.end(), rng);

    AddressMap<ValueT> map(malloc, free);
    const ValueT* result;
    const void* res_p;

    // Insert a bunch of entries
    for (int i = 0; i < N; ++i) {
      char* p = ptrs_and_sizes[i].ptr.get();
      ASSERT_FALSE(map.Find(p));
      int offs = uniform(ptrs_and_sizes[i].size);
      ASSERT_FALSE(map.FindInside(&SizeFunc, kMaxSize, p + offs, &res_p));
      map.Insert(p, std::make_pair(i, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i);
      ASSERT_TRUE(result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p));
      ASSERT_EQ(res_p, p);
      ASSERT_EQ(result->first, i);
      map.Insert(p, std::make_pair(i + N, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + N);
    }

    // Delete the even entries
    for (int i = 0; i < N; i += 2) {
      void* p = ptrs_and_sizes[i].ptr.get();
      ValueT removed;
      ASSERT_TRUE(map.FindAndRemove(p, &removed));
      ASSERT_EQ(removed.first, i + N);
    }

    // Lookup the odd entries and adjust them
    for (int i = 1; i < N; i += 2) {
      char* p = ptrs_and_sizes[i].ptr.get();
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + N);
      int offs = uniform(ptrs_and_sizes[i].size);
      ASSERT_TRUE(result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p));
      ASSERT_EQ(res_p, p);
      ASSERT_EQ(result->first, i + N);
      map.Insert(p, std::make_pair(i + 2*N, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + 2*N);
    }

    // Insert even entries back
    for (int i = 0; i < N; i += 2) {
      char* p = ptrs_and_sizes[i].ptr.get();
      int offs = uniform(ptrs_and_sizes[i].size);
      ASSERT_TRUE(!map.FindInside(&SizeFunc, kMaxSize, p + offs, &res_p));
      map.Insert(p, std::make_pair(i + 2*N, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + 2*N);
      ASSERT_TRUE(result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p));
      ASSERT_EQ(res_p, p);
      ASSERT_EQ(result->first, i + 2*N);
    }

    // Check all entries
    std::set<std::pair<const void*, int> > check_set;
    map.Iterate([&] (const void* ptr, ValueT* val) {
      check_set.insert(std::make_pair(ptr, val->first));
    });
    ASSERT_EQ(check_set.size(), N);
    for (int i = 0; i < N; ++i) {
      void* p = ptrs_and_sizes[i].ptr.get();
      check_set.erase(std::make_pair(p, i + 2*N));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + 2*N);
    }
    ASSERT_EQ(check_set.size(), 0);
  }
}